

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::setEquilibriumPoint(btGeneric6DofSpring2Constraint *this)

{
  long lVar1;
  btVector3 *pbVar2;
  
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  (this->m_linearLimits).m_equilibriumPoint.m_floats[2] = (this->m_calculatedLinearDiff).m_floats[2]
  ;
  *(undefined8 *)(this->m_linearLimits).m_equilibriumPoint.m_floats =
       *(undefined8 *)(this->m_calculatedLinearDiff).m_floats;
  pbVar2 = &this->m_calculatedAxisAngleDiff;
  lVar1 = -0x42;
  do {
    (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[lVar1] = pbVar2->m_floats[0];
    pbVar2 = (btVector3 *)(pbVar2->m_floats + 1);
    lVar1 = lVar1 + 0x16;
  } while (lVar1 != 0);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setEquilibriumPoint()
{
	calculateTransforms();
	int i;
	for( i = 0; i < 3; i++)
		m_linearLimits.m_equilibriumPoint[i] = m_calculatedLinearDiff[i];
	for(i = 0; i < 3; i++)
		m_angularLimits[i].m_equilibriumPoint = m_calculatedAxisAngleDiff[i];
}